

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_> *
Catch::Generators::
makeGenerators<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>
          (binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *val,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_1,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_2,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_3,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_4,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_5,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_6,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_7,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_8,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_9,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_10,
          binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
          *moreGenerators_11)

{
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_RBX;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_RBP;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *in_RDI;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_R12;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_R13;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_R14;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_R15;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *unaff_retaddr;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
  *in_stack_00000008;
  undefined8 in_stack_00000040;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> local_d8;
  undefined8 local_a0;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
  *moreGenerators_3_00;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
  *moreGenerators_2_00;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>
  *in_stack_ffffffffffffff88;
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
  *in_stack_ffffffffffffff90;
  binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> local_68;
  
  moreGenerators_2_00 = &local_68;
  moreGenerators_3_00 = in_RDI;
  value<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>(in_RDI);
  local_a0 = in_stack_00000040;
  makeGenerators<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,&local_d8,moreGenerators_2_00,
             moreGenerators_3_00,unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,
             unaff_retaddr,in_stack_00000008);
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
  ::~GeneratorWrapper((GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
                       *)0x44de11);
  return (Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
          *)in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }